

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O1

void cuddLocalCacheClearAll(DdManager *manager)

{
  DdLocalCache *pDVar1;
  
  for (pDVar1 = manager->localCaches; pDVar1 != (DdLocalCache *)0x0; pDVar1 = pDVar1->next) {
    memset(pDVar1->item,0,(ulong)(pDVar1->itemsize * pDVar1->slots));
  }
  return;
}

Assistant:

void
cuddLocalCacheClearAll(
  DdManager * manager)
{
    DdLocalCache *cache = manager->localCaches;

    while (cache != NULL) {
        memset(cache->item, 0, (size_t)(cache->slots * cache->itemsize));
        cache = cache->next;
    }
    return;

}